

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_copyAssignmentEmptyForEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
::TestBody(optTyped_copyAssignmentEmptyForEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
           *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_;
  storage_type local_31;
  storage_type local_30;
  undefined7 uStack_2f;
  Message local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertHelper local_18;
  
  local_31.null_value = '\a';
  local_28.ss_.ptr_._0_1_ = (EqHelper<false>)0x1;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_1_ = (EqHelper<false>)0x1;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
    ::value((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
             *)&local_31.value);
  }
  testing::Message::Message(&local_28);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_30.value,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x22a,
             "Expected: o2.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_30.value,&local_28);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30.value);
  if (CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) + 8))();
    }
  }
  local_30.null_value =
       (this->
       super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
       ).value_2.value_;
  if (local_31.null_value != '\a') {
    local_30 = local_31;
  }
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)&local_28,"this->value_2","o2.value_or(this->value_2)",
             &(this->
              super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
              ).value_2,&local_30.value);
  if (local_28.ss_.ptr_._0_1_ == (EqHelper<false>)0x0) {
    testing::Message::Message((Message *)&local_30.value);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x22b,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30.value);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (CONCAT71(uStack_2f,local_30.null_value) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(uStack_2f,local_30.null_value) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(uStack_2f,local_30.null_value) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(optTyped, copyAssignmentEmptyForEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1;
  opt_type o2;
  o2 = o1;
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}